

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int gmatch_aux(lua_State *L)

{
  int iVar1;
  ulong *puVar2;
  char *e;
  char *s;
  
  puVar2 = (ulong *)lua_touserdata(L,-0xf462b);
  puVar2[6] = (ulong)L;
  s = (char *)*puVar2;
  if (s <= (char *)puVar2[4]) {
    do {
      *(undefined1 *)((long)puVar2 + 0x3c) = 0;
      e = match((MatchState *)(puVar2 + 3),s,(char *)puVar2[1]);
      if ((e != (char *)0x0) && (e != (char *)puVar2[2])) {
        puVar2[2] = (ulong)e;
        *puVar2 = (ulong)e;
        iVar1 = push_captures((MatchState *)(puVar2 + 3),s,e);
        return iVar1;
      }
      s = s + 1;
    } while (s <= (char *)puVar2[4]);
  }
  return 0;
}

Assistant:

static int gmatch_aux (lua_State *L) {
  GMatchState *gm = (GMatchState *)lua_touserdata(L, lua_upvalueindex(3));
  const char *src;
  gm->ms.L = L;
  for (src = gm->src; src <= gm->ms.src_end; src++) {
    const char *e;
    reprepstate(&gm->ms);
    if ((e = match(&gm->ms, src, gm->p)) != NULL && e != gm->lastmatch) {
      gm->src = gm->lastmatch = e;
      return push_captures(&gm->ms, src, e);
    }
  }
  return 0;  /* not found */
}